

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPair.hpp
# Opt level: O0

void __thiscall antlr::ASTPair::advanceChildToEnd(ASTPair *this)

{
  AST *pAVar1;
  AST *pAVar2;
  ASTRefCount<antlr::AST> *in_RDI;
  ASTRefCount *this_00;
  ASTRefCount local_10 [16];
  
  pAVar1 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)(in_RDI + 1));
  if (pAVar1 != (AST *)0x0) {
    while( true ) {
      pAVar1 = ASTRefCount<antlr::AST>::operator->(in_RDI + 1);
      this_00 = local_10;
      (*pAVar1->_vptr_AST[0xe])();
      pAVar1 = ASTRefCount::operator_cast_to_AST_(this_00);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
      if (pAVar1 == (AST *)0x0) break;
      pAVar2 = ASTRefCount<antlr::AST>::operator->(in_RDI + 1);
      (*pAVar2->_vptr_AST[0xe])();
      ASTRefCount<antlr::AST>::operator=(in_RDI,(ASTRefCount<antlr::AST> *)pAVar1);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
    }
  }
  return;
}

Assistant:

void advanceChildToEnd() {
		if (child) {
			while (child->getNextSibling()) {
				child = child->getNextSibling();
			}
		}
	}